

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

string * __thiscall
spirv_cross::join<char_const(&)[10],char_const*,char_const(&)[3],unsigned_int&,char_const(&)[12]>
          (string *__return_storage_ptr__,spirv_cross *this,char (*ts) [10],char **ts_1,
          char (*ts_2) [3],uint *ts_3,char (*ts_4) [12])

{
  undefined1 local_1128 [8];
  StringStream<4096UL,_4096UL> stream;
  char (*ts_local_4) [12];
  uint *ts_local_3;
  char (*ts_local_2) [3];
  char **ts_local_1;
  char (*ts_local) [10];
  
  stream.saved_buffers.stack_storage.aligned_char._184_8_ = ts_3;
  StringStream<4096UL,_4096UL>::StringStream((StringStream<4096UL,_4096UL> *)local_1128);
  inner::join_helper<char_const(&)[10],char_const*,char_const(&)[3],unsigned_int&,char_const(&)[12]>
            ((StringStream<4096UL,_4096UL> *)local_1128,(char (*) [10])this,(char **)ts,
             (char (*) [3])ts_1,(uint *)ts_2,
             (char (*) [12])stream.saved_buffers.stack_storage.aligned_char._184_8_);
  StringStream<4096ul,4096ul>::str_abi_cxx11_
            (__return_storage_ptr__,(StringStream<4096ul,4096ul> *)local_1128);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1128);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}